

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * flatbuffers::TSMakeRule
                   (string *__return_storage_ptr__,Parser *parser,string *path,string *file_name)

{
  bool bVar1;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  _Self local_318;
  _Self local_310;
  iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  undefined1 local_2b0 [8];
  TsGenerator generator;
  string local_68;
  undefined1 local_48 [8];
  string filebase;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  string *make_rule;
  
  filebase.field_2._8_8_ = file_name;
  StripExtension(&local_68,file_name);
  StripPath((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  ts::TsGenerator::TsGenerator
            ((TsGenerator *)local_2b0,parser,path,(string *)filebase.field_2._8_8_);
  BaseGenerator::GeneratedFileName
            ((string *)&included_files._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BaseGenerator *)local_2b0,path,(string *)local_48,&parser->opts);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &included_files._M_t._M_impl.super__Rb_tree_header._M_node_count,": ");
  std::__cxx11::string::~string
            ((string *)&included_files._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&it,parser,(string *)filebase.field_2._8_8_);
  local_310._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it);
  while( true ) {
    local_318._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it);
    bVar1 = std::operator!=(&local_310,&local_318);
    if (!bVar1) break;
    __rhs = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_310);
    std::operator+(&local_338," ",__rhs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_310);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&it);
  ts::TsGenerator::~TsGenerator((TsGenerator *)local_2b0);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::string TSMakeRule(const Parser &parser, const std::string &path,
                              const std::string &file_name) {
  std::string filebase =
      flatbuffers::StripPath(flatbuffers::StripExtension(file_name));
  ts::TsGenerator generator(parser, path, file_name);
  std::string make_rule =
      generator.GeneratedFileName(path, filebase, parser.opts) + ": ";

  auto included_files = parser.GetIncludedFilesRecursive(file_name);
  for (auto it = included_files.begin(); it != included_files.end(); ++it) {
    make_rule += " " + *it;
  }
  return make_rule;
}